

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall PhPacker_Arg_I_Test::TestBody(PhPacker_Arg_I_Test *this)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  AssertHelper local_188;
  Message local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_3;
  string local_158;
  AssertHelper local_138;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  string local_108;
  uint local_e4;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_b8 [4];
  uint32_t expected;
  uint local_a4;
  undefined1 local_a0 [4];
  uint32_t result;
  string str;
  Message local_78;
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  any local_48;
  uint local_34;
  undefined1 local_30 [4];
  uint32_t res;
  string s;
  PhPacker_Arg_I_Test *this_local;
  
  s.field_2._8_8_ = this;
  PhPacker::pack<unsigned_int,_0>((string *)local_30,'I',0x7b);
  PhPacker::unpack((PhPacker *)&local_48,'I',(string *)local_30);
  uVar2 = std::any_cast<unsigned_int>(&local_48);
  std::any::~any(&local_48);
  local_6c = 0x7b;
  local_34 = uVar2;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_68,"res","123",&local_34,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&str.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&str.field_2 + 8),&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&str.field_2 + 8));
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  PhPacker::pack<unsigned_int,_0>((string *)local_a0,'I',0x270fddc2);
  PhPacker::unpack((PhPacker *)local_b8,'I',(string *)local_a0);
  uVar2 = std::any_cast<unsigned_int>((any *)local_b8);
  std::any::~any((any *)local_b8);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x270fddc2;
  local_a4 = uVar2;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_d0,"result","expected",&local_a4,
             (uint *)((long)&gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x7b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  local_e4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  if (local_e4 == 0) {
    uVar2 = std::numeric_limits<unsigned_int>::max();
    PhPacker::pack<unsigned_int,_0>(&local_108,'I',uVar2);
    std::__cxx11::string::operator=((string *)local_a0,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    PhPacker::unpack((PhPacker *)&gtest_ar_2.message_,'I',(string *)local_a0);
    local_a4 = std::any_cast<unsigned_int>((any *)&gtest_ar_2.message_);
    std::any::~any((any *)&gtest_ar_2.message_);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = std::numeric_limits<unsigned_int>::max();
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_128,"result","expected",&local_a4,
               (uint *)((long)&gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                 ,0x80,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message(&local_130);
    }
    local_e4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    if (local_e4 == 0) {
      uVar2 = std::numeric_limits<unsigned_int>::min();
      PhPacker::pack<unsigned_int,_0>(&local_158,'I',uVar2);
      std::__cxx11::string::operator=((string *)local_a0,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      PhPacker::unpack((PhPacker *)&gtest_ar_3.message_,'I',(string *)local_a0);
      local_a4 = std::any_cast<unsigned_int>((any *)&gtest_ar_3.message_);
      std::any::~any((any *)&gtest_ar_3.message_);
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = std::numeric_limits<unsigned_int>::min();
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((EqHelper *)local_178,"result","expected",&local_a4,
                 (uint *)((long)&gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 4));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
      if (!bVar1) {
        testing::Message::Message(&local_180);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
        testing::internal::AssertHelper::AssertHelper
                  (&local_188,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                   ,0x85,pcVar3);
        testing::internal::AssertHelper::operator=(&local_188,&local_180);
        testing::internal::AssertHelper::~AssertHelper(&local_188);
        testing::Message::~Message(&local_180);
      }
      local_e4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
      if (local_e4 == 0) {
        local_e4 = 0;
      }
    }
  }
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(PhPacker, Arg_I)
{
   auto s = PhPacker::pack('I', 123u);
   uint32_t res = std::any_cast<uint32_t>(PhPacker::unpack('I', s));
   EXPECT_EQ(res, 123);

   std::string str = PhPacker::pack('I', 655351234u);
   uint32_t result = std::any_cast<uint32_t>(PhPacker::unpack('I', str));
   uint32_t expected = 655351234u;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint32_t>('I', std::numeric_limits<uint32_t>::max());
   result = std::any_cast<uint32_t>(PhPacker::unpack('I', str));
   expected = std::numeric_limits<uint32_t>::max();
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint32_t>('I', std::numeric_limits<uint32_t>::min());
   result = std::any_cast<uint32_t>(PhPacker::unpack('I', str));
   expected = std::numeric_limits<uint32_t>::min();
   GTEST_ASSERT_EQ(result, expected);
}